

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O1

void undo_build_ssa(gen_ctx_t gen_ctx)

{
  long lVar1;
  MIR_insn_t_conflict insn;
  void *pvVar2;
  bool bVar3;
  bb_t_conflict pbVar4;
  void *__ptr;
  MIR_insn_t *ppMVar5;
  bb_insn_t pbVar6;
  ulong uVar7;
  ulong uVar8;
  char *pcVar9;
  long lVar10;
  MIR_op_t *pMVar11;
  bb_t_conflict pbVar12;
  size_t unaff_R15;
  int local_64;
  ulong local_60;
  MIR_op_t *local_58;
  bb_t_conflict local_50;
  bb_insn_t local_48;
  long local_40;
  undefined1 *local_38;
  
  free_fake_bb_insns(gen_ctx->ssa_ctx->arg_bb_insns);
  free_fake_bb_insns(gen_ctx->ssa_ctx->undef_insns);
  pbVar12 = (gen_ctx->curr_cfg->bbs).head;
  pbVar4 = local_50;
  do {
    local_50 = pbVar12;
    if (local_50 == (bb_t_conflict)0x0) {
      local_50 = pbVar4;
      for (pbVar12 = (gen_ctx->curr_cfg->bbs).head; pbVar12 != (bb_t_conflict)0x0;
          pbVar12 = (pbVar12->bb_link).next) {
        pbVar6 = (pbVar12->bb_insns).head;
        while (pbVar6 != (bb_insn_t)0x0) {
          ppMVar5 = &pbVar6->insn;
          pbVar6 = (pbVar6->bb_insn_link).next;
          if (*(int *)&(*ppMVar5)->field_0x18 == 0xba) {
            gen_delete_insn(gen_ctx,*ppMVar5);
          }
        }
      }
      return;
    }
    pbVar6 = (local_50->bb_insns).head;
LAB_00156723:
    if (pbVar6 != (bb_insn_t)0x0) {
      insn = pbVar6->insn;
      uVar8 = *(ulong *)&insn->field_0x18 >> 0x20;
      pMVar11 = insn->ops;
      local_38 = &insn->ops[0].field_0x8;
      local_40 = -uVar8;
      uVar7 = 0;
      local_60 = uVar8;
      local_58 = pMVar11;
      local_48 = pbVar6;
      do {
        bVar3 = true;
        if (uVar7 < uVar8) {
          pcVar9 = local_38 + uVar7 * 0x30;
          lVar1 = local_40 + uVar7;
          lVar10 = 0;
          do {
            unaff_R15 = uVar7 + lVar10;
            MIR_insn_op_mode(gen_ctx->ctx,insn,unaff_R15,&local_64);
            uVar8 = local_60;
            pMVar11 = local_58;
            if ((local_64 != 0) && (*pcVar9 != '\v')) {
              if (*pcVar9 != '\x02') {
                __assert_fail("op_ref->mode == MIR_OP_VAR",
                              "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                              ,0x4ff,
                              "int output_insn_var_iterator_next(gen_ctx_t, insn_var_iterator_t *, MIR_reg_t *, int *)"
                             );
              }
              uVar7 = uVar7 + 1 + lVar10;
              bVar3 = false;
              goto LAB_001567f5;
            }
            lVar10 = lVar10 + 1;
            pcVar9 = pcVar9 + 0x30;
          } while (lVar1 + lVar10 != 0);
          unaff_R15 = (size_t)(uint)((int)uVar7 + -1 + (int)lVar10);
          uVar7 = uVar7 + lVar10;
          bVar3 = true;
        }
LAB_001567f5:
        if (bVar3) goto LAB_00156827;
        __ptr = pMVar11[(int)unaff_R15].data;
        while (__ptr != (void *)0x0) {
          pvVar2 = *(void **)((long)__ptr + 0x20);
          free(__ptr);
          __ptr = pvVar2;
        }
      } while( true );
    }
    pbVar12 = (local_50->bb_link).next;
    pbVar4 = local_50;
  } while( true );
LAB_00156827:
  if (*(int *)&insn->field_0x1c != 0) {
    uVar7 = 0;
    do {
      pMVar11->data = (void *)0x0;
      uVar7 = uVar7 + 1;
      pMVar11 = pMVar11 + 1;
    } while (uVar7 < *(uint *)&insn->field_0x1c);
  }
  pbVar6 = (local_48->bb_insn_link).next;
  goto LAB_00156723;
}

Assistant:

static void undo_build_ssa (gen_ctx_t gen_ctx) {
  bb_t bb;
  bb_insn_t bb_insn, next_bb_insn;
  ssa_edge_t se, next_se;
  int op_num;
  MIR_reg_t var;
  MIR_insn_t insn;
  insn_var_iterator_t iter;

  free_fake_bb_insns (arg_bb_insns);
  free_fake_bb_insns (undef_insns);
  for (bb = DLIST_HEAD (bb_t, curr_cfg->bbs); bb != NULL; bb = DLIST_NEXT (bb_t, bb))
    for (bb_insn = DLIST_HEAD (bb_insn_t, bb->bb_insns); bb_insn != NULL;
         bb_insn = DLIST_NEXT (bb_insn_t, bb_insn)) {
      insn = bb_insn->insn;
      FOREACH_OUT_INSN_VAR (gen_ctx, iter, insn, var, op_num) {
        /* all sse after ssa combine available only from defs */
        for (se = insn->ops[op_num].data; se != NULL; se = next_se) {
          next_se = se->next_use;
          free_ssa_edge (se);
        }
      }
      for (size_t i = 0; i < insn->nops; i++) insn->ops[i].data = NULL;
    }
  for (bb = DLIST_HEAD (bb_t, curr_cfg->bbs); bb != NULL; bb = DLIST_NEXT (bb_t, bb))
    for (bb_insn = DLIST_HEAD (bb_insn_t, bb->bb_insns); bb_insn != NULL; bb_insn = next_bb_insn) {
      next_bb_insn = DLIST_NEXT (bb_insn_t, bb_insn);
      if (bb_insn->insn->code == MIR_PHI) gen_delete_insn (gen_ctx, bb_insn->insn);
    }
}